

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDyndepCollation.cxx
# Opt level: O0

bool cmDyndepCollation::IsObjectPrivate(string *object,cmCxxModuleExportInfo *export_info)

{
  bool bVar1;
  pointer ppVar2;
  CxxModuleFileSet *file_set;
  _Self local_30;
  const_iterator fileset_info_itr;
  string *output_path;
  cmCxxModuleExportInfo *export_info_local;
  string *object_local;
  
  fileset_info_itr._M_node = (_Base_ptr)object;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
       ::find(&export_info->ObjectToFileSet,object);
  file_set = (CxxModuleFileSet *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
             ::end(&export_info->ObjectToFileSet);
  bVar1 = std::operator==(&local_30,(_Self *)&file_set);
  if (bVar1) {
    object_local._7_1_ = false;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>
             ::operator->(&local_30);
    bVar1 = cmFileSetVisibilityIsForInterface((ppVar2->second).Visibility);
    object_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  return object_local._7_1_;
}

Assistant:

bool cmDyndepCollation::IsObjectPrivate(
  std::string const& object, cmCxxModuleExportInfo const& export_info)
{
#ifdef _WIN32
  std::string output_path = object;
  cmSystemTools::ConvertToUnixSlashes(output_path);
#else
  std::string const& output_path = object;
#endif
  auto fileset_info_itr = export_info.ObjectToFileSet.find(output_path);
  if (fileset_info_itr == export_info.ObjectToFileSet.end()) {
    return false;
  }
  auto const& file_set = fileset_info_itr->second;
  return !cmFileSetVisibilityIsForInterface(file_set.Visibility);
}